

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::CompressedTextureSubImage<3u>
          (CompressedSubImageTest *this,GLint internalformat)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1c0;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x2f8))
            (this->m_to,0,0,0,0,4,4,4,internalformat,this->m_reference_size,this->m_reference);
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (iVar1 != 0) {
    local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"glCompressedTextureSubImage2D unexpectedly generated error "
                   );
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this_00);
    std::operator<<((ostream *)this_00," during the test with internal format ");
    local_1c0.m_getName = glu::getTextureFormatName;
    local_1c0.m_value = internalformat;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,". Test fails.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return iVar1 == 0;
}

Assistant:

bool CompressedSubImageTest::CompressedTextureSubImage<3>(glw::GLint internalformat)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Load texture image with tested function. */
	gl.compressedTextureSubImage3D(m_to, 0, 0, 0, 0, s_texture_width, s_texture_height, s_texture_depth, internalformat,
								   m_reference_size, m_reference);

	/* Check errors. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glCompressedTextureSubImage2D unexpectedly generated error "
			<< glu::getErrorStr(error) << " during the test with internal format "
			<< glu::getTextureFormatStr(internalformat) << ". Test fails." << tcu::TestLog::EndMessage;

		return false;
	}
	return true;
}